

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

TimeZone * __thiscall
icu_63::TimeZoneFormat::parse
          (TimeZoneFormat *this,UTimeZoneFormatStyle style,UnicodeString *text,ParsePosition *pos,
          int32_t parseOptions,UTimeZoneFormatTimeType *timeType)

{
  short sVar1;
  uint start;
  UTimeZoneFormatTimeType *pUVar2;
  int32_t iVar3;
  UErrorCode UVar4;
  int iVar5;
  int32_t iVar6;
  UTimeZoneNameType UVar7;
  undefined4 extraout_var;
  TimeZone *pTVar8;
  undefined4 extraout_var_00;
  TimeZoneFormat *pTVar9;
  TimeZoneFormat *pTVar10;
  TimeZoneFormat *pTVar11;
  undefined4 extraout_var_01;
  TimeZoneFormat *matches;
  uint32_t types;
  uint uVar12;
  undefined8 uVar13;
  ParsePosition *pPVar14;
  int32_t i;
  UTimeZoneFormatTimeType UVar15;
  uint uVar16;
  int idx;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  UErrorCode status;
  UBool hasDigitOffset_2;
  UnicodeString tzID;
  UnicodeString parsedID;
  UChar parsedIDBuf [32];
  UChar tzIDBuf [32];
  UErrorCode local_198;
  int32_t local_194;
  uint local_190;
  UErrorCode local_18c;
  ParsePosition local_188;
  ParsePosition *local_178;
  UnicodeString *local_170;
  UTimeZoneFormatTimeType local_164;
  TimeZoneFormat *local_160;
  UTimeZoneFormatTimeType *local_158;
  ulong local_150;
  TimeZoneFormat *local_148;
  ulong local_140;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  UTimeZoneFormatTimeType local_b8 [16];
  char local_78 [72];
  undefined4 extraout_var_02;
  
  local_150 = CONCAT44(local_150._4_4_,parseOptions);
  uVar17 = (ulong)style;
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  }
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    local_190 = (text->fUnion).fFields.fLength;
  }
  else {
    local_190 = (int)sVar1 >> 5;
  }
  start = pos->index;
  local_188.index = start;
  local_178 = pos;
  local_170 = text;
  local_160 = this;
  if ((UTZFMT_STYLE_SPECIFIC_LONG < style) || (bVar19 = style == UTZFMT_STYLE_GENERIC_SHORT, bVar19)
     ) {
    bVar20 = style == UTZFMT_STYLE_SPECIFIC_SHORT;
    bVar19 = style == UTZFMT_STYLE_GENERIC_SHORT || bVar20;
    local_188.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b73a0;
    local_188.errorIndex = -1;
    if ((style == UTZFMT_STYLE_SPECIFIC_SHORT) || (style == UTZFMT_STYLE_GENERIC_SHORT))
    goto LAB_001fdc9d;
    local_18c = U_ZERO_ERROR;
    local_194 = 0x7fffffff;
    uVar18 = 0xffffffff;
  }
  else {
    bVar20 = false;
LAB_001fdc9d:
    local_188.errorIndex = -1;
    local_188.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b73a0;
    local_78[0] = '\0';
    local_194 = parseOffsetLocalizedGMT(this,text,&local_188,bVar19,local_78);
    if (local_188.errorIndex == -1) {
      if ((local_188.index == local_190) || (uVar18 = local_188.index, local_78[0] != '\0')) {
        local_178->index = local_188.index;
        pTVar8 = createTimeZoneForOffset(this,local_194);
        goto LAB_001fe5e8;
      }
    }
    else {
      local_194 = 0x7fffffff;
      uVar18 = 0xffffffff;
    }
    local_18c = ~(U_ERROR_WARNING_START|U_STANDARD_ERROR_LIMIT);
  }
  local_198 = U_ZERO_ERROR;
  pTVar11 = (TimeZoneFormat *)local_138;
  UnicodeString::UnicodeString((UnicodeString *)pTVar11,(UChar *)local_78,0,0x20);
  pPVar14 = local_178;
  pUVar2 = timeType;
  local_140 = uVar17;
  switch(uVar17) {
  case 0:
    types = 1;
    goto LAB_001fdf37;
  case 1:
    types = 3;
    goto LAB_001fdf37;
  case 2:
    types = 5;
LAB_001fdf37:
    local_b8[0] = UTZFMT_TIME_TYPE_UNKNOWN;
    pTVar11 = (TimeZoneFormat *)getTimeZoneGenericNames(local_160,&local_198);
    pPVar14 = local_178;
    if ((local_198 < U_ILLEGAL_ARGUMENT_ERROR) &&
       (iVar3 = TimeZoneGenericNames::findBestMatch
                          ((TimeZoneGenericNames *)pTVar11,local_170,start,types,
                           (UnicodeString *)local_138,local_b8,&local_198),
       local_198 < U_ILLEGAL_ARGUMENT_ERROR)) {
      pUVar2 = timeType;
      if (iVar3 < 1) break;
      if (timeType != (UTimeZoneFormatTimeType *)0x0) {
        *timeType = local_b8[0];
      }
      pPVar14->index = iVar3 + start;
      pTVar8 = TimeZone::createTimeZone((UnicodeString *)local_138);
    }
    else {
      pPVar14->errorIndex = start;
      pTVar8 = (TimeZone *)0x0;
    }
    goto LAB_001fe5de;
  case 3:
    uVar13 = 6;
    goto LAB_001fdebb;
  case 4:
    uVar13 = 0x30;
LAB_001fdebb:
    pTVar11 = (TimeZoneFormat *)local_160->fTimeZoneNames;
    iVar5 = (*(pTVar11->super_Format).super_UObject._vptr_UObject[0xf])
                      (pTVar11,local_170,(ulong)start,uVar13,&local_198);
    pTVar10 = (TimeZoneFormat *)CONCAT44(extraout_var,iVar5);
    if (local_198 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_148 = (TimeZoneFormat *)CONCAT44(local_148._4_4_,(int)uVar13);
      pTVar8 = (TimeZone *)timeType;
      local_158 = timeType;
      if (pTVar10 != (TimeZoneFormat *)0x0) {
        pTVar8 = (TimeZone *)0xffffffff;
        uVar12 = 0xffffffff;
        for (uVar16 = 0; pTVar11 = pTVar10,
            iVar3 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)pTVar10),
            pPVar14 = local_178, (int)uVar16 < iVar3; uVar16 = uVar16 + 1) {
          iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                            ((MatchInfoCollection *)pTVar10,uVar16);
          uVar12 = iVar3 + start;
          if ((int)uVar18 < (int)uVar12) {
            pTVar8 = (TimeZone *)(ulong)uVar16;
            uVar18 = uVar12;
          }
        }
        iVar5 = (int)pTVar8;
        if (-1 < iVar5) {
          if (local_158 != (UTimeZoneFormatTimeType *)0x0) {
            UVar7 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                              ((MatchInfoCollection *)pTVar10,iVar5);
            UVar15 = UTZFMT_TIME_TYPE_STANDARD;
            if ((int)UVar7 < 0x10) {
              if (UVar7 != UTZNM_LONG_STANDARD) {
                if (UVar7 != UTZNM_LONG_DAYLIGHT) goto LAB_001fe3c4;
LAB_001fe7c1:
                UVar15 = UTZFMT_TIME_TYPE_DAYLIGHT;
              }
            }
            else if (UVar7 != UTZNM_SHORT_STANDARD) {
              if (UVar7 == UTZNM_SHORT_DAYLIGHT) goto LAB_001fe7c1;
LAB_001fe3c4:
              UVar15 = UTZFMT_TIME_TYPE_UNKNOWN;
            }
            *local_158 = UVar15;
          }
          pPVar14->index = uVar12;
          getTimeZoneID(local_160,(MatchInfoCollection *)pTVar10,iVar5,(UnicodeString *)local_138);
          pTVar11 = (TimeZoneFormat *)local_138;
          pTVar8 = TimeZone::createTimeZone((UnicodeString *)pTVar11);
          bVar19 = false;
          goto LAB_001fdf05;
        }
      }
      bVar19 = true;
      pPVar14 = local_178;
      if ((bVar20 && (local_150 & 2) != 0) &&
         (pTVar11 = local_160, pTVar9 = (TimeZoneFormat *)getTZDBTimeZoneNames(local_160,&local_198)
         , pPVar14 = local_178, local_198 < U_ILLEGAL_ARGUMENT_ERROR)) {
        iVar5 = (*(pTVar9->super_Format).super_UObject._vptr_UObject[0xf])
                          (pTVar9,local_170,(ulong)start,(ulong)local_148 & 0xffffffff,&local_198);
        matches = (TimeZoneFormat *)CONCAT44(extraout_var_02,iVar5);
        if (local_198 < U_ILLEGAL_ARGUMENT_ERROR) {
          pTVar11 = pTVar9;
          if (matches == (TimeZoneFormat *)0x0) goto LAB_001fdf05;
          pTVar8 = (TimeZone *)0xffffffff;
          uVar12 = 0xffffffff;
          local_148 = matches;
          for (uVar16 = 0; pTVar9 = local_148,
              iVar3 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)local_148),
              matches = local_148, (int)uVar16 < iVar3; uVar16 = uVar16 + 1) {
            iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                              ((MatchInfoCollection *)local_148,uVar16);
            uVar12 = iVar3 + start;
            if ((int)uVar18 < (int)uVar12) {
              pTVar8 = (TimeZone *)(ulong)uVar16;
              uVar18 = uVar12;
            }
          }
          iVar5 = (int)pTVar8;
          if (iVar5 < 0) {
            bVar19 = true;
          }
          else {
            if (local_158 != (UTimeZoneFormatTimeType *)0x0) {
              UVar7 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                                ((MatchInfoCollection *)local_148,iVar5);
              UVar15 = UTZFMT_TIME_TYPE_STANDARD;
              if ((int)UVar7 < 0x10) {
                if (UVar7 != UTZNM_LONG_STANDARD) {
                  if (UVar7 != UTZNM_LONG_DAYLIGHT) goto LAB_001fe9c1;
LAB_001fe9db:
                  UVar15 = UTZFMT_TIME_TYPE_DAYLIGHT;
                }
              }
              else if (UVar7 != UTZNM_SHORT_STANDARD) {
                if (UVar7 == UTZNM_SHORT_DAYLIGHT) goto LAB_001fe9db;
LAB_001fe9c1:
                UVar15 = UTZFMT_TIME_TYPE_UNKNOWN;
              }
              *local_158 = UVar15;
            }
            pPVar14->index = uVar12;
            getTimeZoneID(local_160,(MatchInfoCollection *)matches,iVar5,(UnicodeString *)local_138)
            ;
            pTVar9 = (TimeZoneFormat *)local_138;
            pTVar8 = TimeZone::createTimeZone((UnicodeString *)pTVar9);
            bVar19 = false;
          }
        }
        else {
          pPVar14->errorIndex = start;
          bVar19 = false;
          pTVar8 = (TimeZone *)0x0;
        }
        pTVar11 = pTVar9;
        if (matches != (TimeZoneFormat *)0x0) {
          (*(matches->super_Format).super_UObject._vptr_UObject[1])();
          pTVar11 = matches;
        }
      }
    }
    else {
      local_178->errorIndex = start;
      bVar19 = false;
      pTVar8 = (TimeZone *)0x0;
      pPVar14 = local_178;
      local_158 = timeType;
    }
LAB_001fdf05:
    if (pTVar10 != (TimeZoneFormat *)0x0) {
      (*(pTVar10->super_Format).super_UObject._vptr_UObject[1])();
      pTVar11 = pTVar10;
    }
    timeType = (UTimeZoneFormatTimeType *)pTVar8;
    pUVar2 = local_158;
    if (bVar19) break;
    goto LAB_001fe5de;
  case 5:
    local_188.errorIndex = -1;
    pTVar11 = local_160;
    local_188.index = start;
    iVar3 = parseOffsetLocalizedGMT(local_160,local_170,&local_188,'\0',(UBool *)0x0);
    pPVar14 = local_178;
    uVar12 = local_188.index;
    if (local_188.errorIndex != -1) {
      local_18c = local_18c | 0x40;
      pUVar2 = timeType;
      break;
    }
    goto LAB_001fe05b;
  case 6:
    local_188.errorIndex = -1;
    pTVar11 = local_160;
    local_188.index = start;
    iVar3 = parseOffsetLocalizedGMT(local_160,local_170,&local_188,'\x01',(UBool *)0x0);
    pPVar14 = local_178;
    uVar12 = local_188.index;
    if (local_188.errorIndex == -1) goto LAB_001fe05b;
    local_18c = local_18c | 0x20;
    pUVar2 = timeType;
    break;
  case 7:
  case 9:
  case 0xb:
  case 0xd:
  case 0xf:
    local_188.errorIndex = -1;
    local_188.index = start;
    local_158 = timeType;
    iVar3 = parseOffsetISO8601(pTVar11,local_170,&local_188,'\0',(UBool *)0x0);
    pPVar14 = local_178;
    uVar12 = local_188.index;
    pUVar2 = local_158;
    if (local_188.errorIndex == -1) goto LAB_001fe05b;
    break;
  case 8:
  case 10:
  case 0xc:
  case 0xe:
  case 0x10:
    local_188.errorIndex = -1;
    local_b8[0] = local_b8[0] & 0xffffff00;
    local_188.index = start;
    iVar3 = parseOffsetISO8601(pTVar11,local_170,&local_188,'\0',(UBool *)local_b8);
    pPVar14 = local_178;
    pUVar2 = timeType;
    if ((local_188.errorIndex != -1) ||
       (pUVar2 = timeType, (undefined1)local_b8[0] == UTZFMT_TIME_TYPE_UNKNOWN)) break;
    local_178->index = local_188.index;
    pTVar8 = createTimeZoneForOffset(pTVar11,iVar3);
    goto LAB_001fe5de;
  case 0x11:
    local_188.errorIndex = -1;
    local_188.index = start;
    parseZoneID(pTVar11,local_170,&local_188,(UnicodeString *)local_138);
    goto LAB_001fe041;
  case 0x12:
    local_188.errorIndex = -1;
    local_188.index = start;
    parseShortZoneID(pTVar11,local_170,&local_188,(UnicodeString *)local_138);
    goto LAB_001fe041;
  case 0x13:
    local_188.errorIndex = -1;
    pTVar11 = local_160;
    local_188.index = start;
    parseExemplarLocation(local_160,local_170,&local_188,(UnicodeString *)local_138);
LAB_001fe041:
    pPVar14 = local_178;
    pUVar2 = timeType;
    if (local_188.errorIndex != -1) break;
    local_178->index = local_188.index;
    local_158 = timeType;
    pTVar8 = TimeZone::createTimeZone((UnicodeString *)local_138);
    goto LAB_001fe5de;
  }
  local_158 = pUVar2;
  uVar12 = uVar18;
  iVar3 = local_194;
  if ((int)start < (int)uVar18) {
LAB_001fe05b:
    local_194 = iVar3;
    pPVar14->index = uVar12;
    pTVar8 = createTimeZoneForOffset(pTVar11,local_194);
  }
  else {
    local_140 = CONCAT44(local_140._4_4_,(uint)*(ushort *)(STYLE_PARSE_FLAGS + local_140 * 2));
    pTVar11 = (TimeZoneFormat *)local_f8;
    UnicodeString::UnicodeString((UnicodeString *)pTVar11,(UChar *)local_b8,0,0x20);
    if (((int)uVar18 < (int)local_190) && (((UErrorCode)local_140 & 0x180U) != 0x180)) {
      local_188.errorIndex = -1;
      local_164 = local_164 & 0xffffff00;
      local_188.index = start;
      iVar3 = parseOffsetISO8601(pTVar11,local_170,&local_188,'\0',(UBool *)&local_164);
      if (local_188.errorIndex != -1) goto LAB_001fe0f4;
      if ((local_188.index != local_190) && ((undefined1)local_164 == UTZFMT_TIME_TYPE_UNKNOWN)) {
        if ((int)uVar18 < local_188.index) {
          pTVar11 = (TimeZoneFormat *)local_f8;
          UnicodeString::setToBogus((UnicodeString *)pTVar11);
          uVar18 = local_188.index;
          local_194 = iVar3;
        }
        goto LAB_001fe0f4;
      }
      pPVar14->index = local_188.index;
      timeType = (UTimeZoneFormatTimeType *)createTimeZoneForOffset(pTVar11,iVar3);
    }
    else {
LAB_001fe0f4:
      UVar4 = local_18c | (UErrorCode)local_140;
      if (((int)uVar18 < (int)local_190) && ((UVar4 & 0x20) == U_ZERO_ERROR)) {
        local_188.errorIndex = -1;
        local_164 = local_164 & 0xffffff00;
        pTVar11 = local_160;
        local_188.index = start;
        iVar3 = parseOffsetLocalizedGMT(local_160,local_170,&local_188,'\0',(UBool *)&local_164);
        if (local_188.errorIndex == -1) {
          if ((local_188.index == local_190) || ((undefined1)local_164 != UTZFMT_TIME_TYPE_UNKNOWN))
          {
            pPVar14->index = local_188.index;
            timeType = (UTimeZoneFormatTimeType *)createTimeZoneForOffset(pTVar11,iVar3);
            goto LAB_001fe5d1;
          }
          if ((int)uVar18 < local_188.index) {
            pTVar11 = (TimeZoneFormat *)local_f8;
            UnicodeString::setToBogus((UnicodeString *)pTVar11);
            uVar18 = local_188.index;
            local_194 = iVar3;
          }
        }
      }
      if (((int)uVar18 < (int)local_190) && ((UVar4 & 0x40) == U_ZERO_ERROR)) {
        local_188.errorIndex = -1;
        local_164 = local_164 & 0xffffff00;
        pTVar11 = local_160;
        local_188.index = start;
        iVar3 = parseOffsetLocalizedGMT(local_160,local_170,&local_188,'\x01',(UBool *)&local_164);
        if (local_188.errorIndex == -1) {
          if ((local_188.index == local_190) || ((undefined1)local_164 != UTZFMT_TIME_TYPE_UNKNOWN))
          {
            pPVar14->index = local_188.index;
            timeType = (UTimeZoneFormatTimeType *)createTimeZoneForOffset(pTVar11,iVar3);
            goto LAB_001fe5d1;
          }
          if ((int)uVar18 < local_188.index) {
            pTVar11 = (TimeZoneFormat *)local_f8;
            UnicodeString::setToBogus((UnicodeString *)pTVar11);
            uVar18 = local_188.index;
            local_194 = iVar3;
          }
        }
      }
      if ((local_150 & 1) == 0) {
        UVar15 = UTZFMT_TIME_TYPE_UNKNOWN;
LAB_001fe1ce:
        if ((int)start < (int)uVar18) {
          if (-1 < (short)local_f8._8_2_) {
            local_f8._12_4_ = (int)(short)local_f8._8_2_ >> 5;
          }
          if ((int)local_f8._12_4_ < 1) {
            timeType = (UTimeZoneFormatTimeType *)createTimeZoneForOffset(pTVar11,local_194);
          }
          else {
            timeType = (UTimeZoneFormatTimeType *)
                       TimeZone::createTimeZone((UnicodeString *)local_f8);
          }
          if (local_158 != (UTimeZoneFormatTimeType *)0x0) {
            *local_158 = UVar15;
          }
          pPVar14->index = uVar18;
          goto LAB_001fe5d1;
        }
LAB_001fe5cb:
        pPVar14->errorIndex = start;
      }
      else {
        uVar17 = 0;
        if ((int)uVar18 < (int)local_190) {
          pTVar11 = (TimeZoneFormat *)local_160->fTimeZoneNames;
          iVar5 = (*(pTVar11->super_Format).super_UObject._vptr_UObject[0xf])
                            (pTVar11,local_170,(ulong)start,0x76,&local_198);
          pTVar10 = (TimeZoneFormat *)CONCAT44(extraout_var_00,iVar5);
          local_18c = local_198;
          if (local_198 < U_ILLEGAL_ARGUMENT_ERROR) {
            if (pTVar10 == (TimeZoneFormat *)0x0) {
              iVar3 = -1;
              uVar12 = 0xffffffff;
            }
            else {
              iVar3 = -1;
              uVar12 = 0xffffffff;
              for (iVar5 = 0; pTVar11 = pTVar10,
                  iVar6 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)pTVar10),
                  iVar5 < iVar6; iVar5 = iVar5 + 1) {
                iVar6 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                  ((MatchInfoCollection *)pTVar10,iVar5);
                if ((int)uVar12 < (int)(iVar6 + start)) {
                  iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                    ((MatchInfoCollection *)pTVar10,iVar5);
                  uVar12 = iVar3 + start;
                  iVar3 = iVar5;
                }
              }
            }
            uVar17 = 0;
            if ((int)uVar12 <= (int)uVar18) goto LAB_001fe517;
            getTimeZoneID(local_160,(MatchInfoCollection *)pTVar10,iVar3,(UnicodeString *)local_f8);
            pTVar11 = pTVar10;
            UVar7 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                              ((MatchInfoCollection *)pTVar10,iVar3);
            local_194 = 0x7fffffff;
            uVar18 = uVar12;
            if ((int)UVar7 < 0x10) {
              if (UVar7 == UTZNM_LONG_STANDARD) {
LAB_001fe887:
                uVar17 = 1;
              }
              else if (UVar7 == UTZNM_LONG_DAYLIGHT) {
LAB_001fe7a8:
                uVar17 = 2;
              }
            }
            else {
              if (UVar7 == UTZNM_SHORT_STANDARD) goto LAB_001fe887;
              if (UVar7 == UTZNM_SHORT_DAYLIGHT) goto LAB_001fe7a8;
            }
          }
          else {
            local_178->errorIndex = start;
            timeType = (UTimeZoneFormatTimeType *)0x0;
LAB_001fe517:
            uVar17 = 0;
          }
          UVar4 = local_18c;
          if (pTVar10 != (TimeZoneFormat *)0x0) {
            (*(pTVar10->super_Format).super_UObject._vptr_UObject[1])();
            pTVar11 = pTVar10;
          }
          pPVar14 = local_178;
          if (U_ZERO_ERROR < UVar4) goto LAB_001fe5d1;
        }
        if (((((local_150 & 2) == 0) || ((int)local_190 <= (int)uVar18)) ||
            ((local_140 & 0x10) != 0)) ||
           (pTVar11 = local_160,
           pTVar10 = (TimeZoneFormat *)getTZDBTimeZoneNames(local_160,&local_198),
           U_ZERO_ERROR < local_198)) {
LAB_001fe567:
          UVar15 = (UTimeZoneFormatTimeType)uVar17;
          if ((int)local_190 <= (int)uVar18) {
            uVar12 = (UErrorCode)local_140;
LAB_001fe60c:
            if (((int)uVar18 < (int)local_190) && ((uVar12 & 0x200) == 0)) {
              local_188.errorIndex = -1;
              local_188.index = start;
              parseZoneID(pTVar11,local_170,&local_188,(UnicodeString *)local_138);
              iVar3 = local_188.index;
              if ((local_188.errorIndex == -1) && ((int)uVar18 < local_188.index)) {
                UVar15 = UTZFMT_TIME_TYPE_UNKNOWN;
                local_194 = 0x7fffffff;
                pTVar11 = (TimeZoneFormat *)local_f8;
                UnicodeString::copyFrom((UnicodeString *)pTVar11,(UnicodeString *)local_138,'\0');
                uVar18 = iVar3;
              }
            }
            if (((int)uVar18 < (int)local_190) && ((uVar12 & 0x200) == 0)) {
              local_188.errorIndex = -1;
              local_188.index = start;
              parseShortZoneID(pTVar11,local_170,&local_188,(UnicodeString *)local_138);
              iVar3 = local_188.index;
              if ((local_188.errorIndex == -1) && ((int)uVar18 < local_188.index)) {
                UVar15 = UTZFMT_TIME_TYPE_UNKNOWN;
                local_194 = 0x7fffffff;
                pTVar11 = (TimeZoneFormat *)local_f8;
                UnicodeString::copyFrom((UnicodeString *)pTVar11,(UnicodeString *)local_138,'\0');
                uVar18 = iVar3;
              }
            }
            goto LAB_001fe1ce;
          }
          local_164 = UTZFMT_TIME_TYPE_UNKNOWN;
          pTVar11 = (TimeZoneFormat *)getTimeZoneGenericNames(local_160,&local_198);
          uVar12 = (UErrorCode)local_140;
          if ((local_198 < U_ILLEGAL_ARGUMENT_ERROR) &&
             (iVar3 = TimeZoneGenericNames::findBestMatch
                                ((TimeZoneGenericNames *)pTVar11,local_170,start,7,
                                 (UnicodeString *)local_138,&local_164,&local_198),
             local_198 < U_ILLEGAL_ARGUMENT_ERROR)) {
            if ((0 < iVar3) && ((int)uVar18 < (int)(iVar3 + start))) {
              pTVar11 = (TimeZoneFormat *)local_f8;
              UnicodeString::copyFrom((UnicodeString *)pTVar11,(UnicodeString *)local_138,'\0');
              local_194 = 0x7fffffff;
              uVar18 = iVar3 + start;
              UVar15 = local_164;
            }
            goto LAB_001fe60c;
          }
          goto LAB_001fe5cb;
        }
        iVar5 = (*(pTVar10->super_Format).super_UObject._vptr_UObject[0xf])
                          (pTVar10,local_170,(ulong)start,0x76,&local_198);
        pTVar9 = (TimeZoneFormat *)CONCAT44(extraout_var_01,iVar5);
        if (local_198 < U_ILLEGAL_ARGUMENT_ERROR) {
          local_18c = local_198;
          local_150 = uVar17;
          if (pTVar9 == (TimeZoneFormat *)0x0) {
            iVar5 = -1;
            uVar12 = 0xffffffff;
          }
          else {
            iVar5 = -1;
            uVar12 = 0xffffffff;
            for (idx = 0; pTVar10 = pTVar9,
                iVar3 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)pTVar9),
                idx < iVar3; idx = idx + 1) {
              iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                ((MatchInfoCollection *)pTVar9,idx);
              if ((int)uVar12 < (int)(iVar3 + start)) {
                iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                  ((MatchInfoCollection *)pTVar9,idx);
                uVar12 = iVar3 + start;
                iVar5 = idx;
              }
            }
          }
          if ((int)uVar18 < (int)uVar12) {
            getTimeZoneID(local_160,(MatchInfoCollection *)pTVar9,iVar5,(UnicodeString *)local_f8);
            pTVar10 = pTVar9;
            UVar7 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                              ((MatchInfoCollection *)pTVar9,iVar5);
            local_150 = 1;
            local_194 = 0x7fffffff;
            uVar18 = uVar12;
            if ((int)UVar7 < 0x10) {
              if (UVar7 != UTZNM_LONG_STANDARD) {
                if (UVar7 != UTZNM_LONG_DAYLIGHT) goto LAB_001fe8f5;
LAB_001fe95b:
                local_150 = 2;
              }
            }
            else if (UVar7 != UTZNM_SHORT_STANDARD) {
              if (UVar7 == UTZNM_SHORT_DAYLIGHT) goto LAB_001fe95b;
LAB_001fe8f5:
              local_150 = 0;
            }
          }
          pTVar11 = pTVar10;
          if (pTVar9 != (TimeZoneFormat *)0x0) {
            (*(pTVar9->super_Format).super_UObject._vptr_UObject[1])();
            pTVar11 = pTVar9;
          }
          pPVar14 = local_178;
          uVar17 = local_150;
          if (U_ZERO_ERROR < local_18c) goto LAB_001fe5d1;
          goto LAB_001fe567;
        }
        local_178->errorIndex = start;
        if (pTVar9 != (TimeZoneFormat *)0x0) {
          (*(pTVar9->super_Format).super_UObject._vptr_UObject[1])(pTVar9);
        }
      }
      timeType = (UTimeZoneFormatTimeType *)0x0;
    }
LAB_001fe5d1:
    UnicodeString::~UnicodeString((UnicodeString *)local_f8);
    pTVar8 = (TimeZone *)timeType;
  }
LAB_001fe5de:
  UnicodeString::~UnicodeString((UnicodeString *)local_138);
LAB_001fe5e8:
  ParsePosition::~ParsePosition(&local_188);
  return pTVar8;
}

Assistant:

TimeZone*
TimeZoneFormat::parse(UTimeZoneFormatStyle style, const UnicodeString& text, ParsePosition& pos,
        int32_t parseOptions, UTimeZoneFormatTimeType* timeType /* = NULL */) const {
    if (timeType) {
        *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    }

    int32_t startIdx = pos.getIndex();
    int32_t maxPos = text.length();
    int32_t offset;

    // Styles using localized GMT format as fallback
    UBool fallbackLocalizedGMT = 
        (style == UTZFMT_STYLE_SPECIFIC_LONG || style == UTZFMT_STYLE_GENERIC_LONG || style == UTZFMT_STYLE_GENERIC_LOCATION);
    UBool fallbackShortLocalizedGMT =
        (style == UTZFMT_STYLE_SPECIFIC_SHORT || style == UTZFMT_STYLE_GENERIC_SHORT);

    int32_t evaluated = 0;  // bit flags representing already evaluated styles
    ParsePosition tmpPos(startIdx);

    int32_t parsedOffset = UNKNOWN_OFFSET;  // stores successfully parsed offset for later use
    int32_t parsedPos = -1;                 // stores successfully parsed offset position for later use

    // Try localized GMT format first if necessary
    if (fallbackLocalizedGMT || fallbackShortLocalizedGMT) {
        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, fallbackShortLocalizedGMT, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            // Even when the input text was successfully parsed as a localized GMT format text,
            // we may still need to evaluate the specified style if -
            //   1) GMT zero format was used, and
            //   2) The input text was not completely processed
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            parsedOffset = offset;
            parsedPos = tmpPos.getIndex();
        }
        // Note: For now, no distinction between long/short localized GMT format in the parser.
        // This might be changed in future.
        // evaluated |= (fallbackLocalizedGMT ? STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT] : STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT]);
        evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT] | STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT];
    }

    UErrorCode status = U_ZERO_ERROR;
    UChar tzIDBuf[32];
    UnicodeString tzID(tzIDBuf, 0, UPRV_LENGTHOF(tzIDBuf));

    UBool parseTZDBAbbrev = ((parseOptions & UTZFMT_PARSE_OPTION_TZ_DATABASE_ABBREVIATIONS) != 0);

    // Try the specified style
    switch (style) {
    case UTZFMT_STYLE_LOCALIZED_GMT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetLocalizedGMT(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            // Note: For now, no distinction between long/short localized GMT format in the parser.
            // This might be changed in future.
            evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT];

            break;
        }
    case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetShortLocalizedGMT(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            // Note: For now, no distinction between long/short localized GMT format in the parser.
            // This might be changed in future.
            evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT];

            break;
        }
    case UTZFMT_STYLE_ISO_BASIC_SHORT:
    case UTZFMT_STYLE_ISO_BASIC_FIXED:
    case UTZFMT_STYLE_ISO_BASIC_FULL:
    case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
    case UTZFMT_STYLE_ISO_EXTENDED_FULL:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetISO8601(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            break;
        }

    case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
    case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
    case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
    case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
    case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            // Exclude the case of UTC Indicator "Z" here
            UBool hasDigitOffset = FALSE;
            offset = parseOffsetISO8601(text, tmpPos, FALSE, &hasDigitOffset);
            if (tmpPos.getErrorIndex() == -1 && hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            break;
        }

    case UTZFMT_STYLE_SPECIFIC_LONG:
    case UTZFMT_STYLE_SPECIFIC_SHORT:
        {
            // Specific styles
            int32_t nameTypes = 0;
            if (style == UTZFMT_STYLE_SPECIFIC_LONG) {
                nameTypes = (UTZNM_LONG_STANDARD | UTZNM_LONG_DAYLIGHT);
            } else {
                U_ASSERT(style == UTZFMT_STYLE_SPECIFIC_SHORT);
                nameTypes = (UTZNM_SHORT_STANDARD | UTZNM_SHORT_DAYLIGHT);
            }
            LocalPointer<TimeZoneNames::MatchInfoCollection> specificMatches(fTimeZoneNames->find(text, startIdx, nameTypes, status));
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            if (!specificMatches.isNull()) {
                int32_t matchIdx = -1;
                int32_t matchPos = -1;
                for (int32_t i = 0; i < specificMatches->size(); i++) {
                    matchPos  = startIdx + specificMatches->getMatchLengthAt(i);
                    if (matchPos > parsedPos) {
                        matchIdx = i;
                        parsedPos = matchPos;
                    }
                }
                if (matchIdx >= 0) {
                    if (timeType) {
                        *timeType = getTimeType(specificMatches->getNameTypeAt(matchIdx));
                    }
                    pos.setIndex(matchPos);
                    getTimeZoneID(specificMatches.getAlias(), matchIdx, tzID);
                    U_ASSERT(!tzID.isEmpty());
                    return TimeZone::createTimeZone(tzID);
                }
            }

            if (parseTZDBAbbrev && style == UTZFMT_STYLE_SPECIFIC_SHORT) {
                U_ASSERT((nameTypes & UTZNM_SHORT_STANDARD) != 0);
                U_ASSERT((nameTypes & UTZNM_SHORT_DAYLIGHT) != 0);

                const TZDBTimeZoneNames *tzdbTimeZoneNames = getTZDBTimeZoneNames(status);
                if (U_SUCCESS(status)) {
                    LocalPointer<TimeZoneNames::MatchInfoCollection> tzdbNameMatches(
                        tzdbTimeZoneNames->find(text, startIdx, nameTypes, status));
                    if (U_FAILURE(status)) {
                        pos.setErrorIndex(startIdx);
                        return NULL;
                    }
                    if (!tzdbNameMatches.isNull()) {
                        int32_t matchIdx = -1;
                        int32_t matchPos = -1;
                        for (int32_t i = 0; i < tzdbNameMatches->size(); i++) {
                            matchPos = startIdx + tzdbNameMatches->getMatchLengthAt(i);
                            if (matchPos > parsedPos) {
                                matchIdx = i;
                                parsedPos = matchPos;
                            }
                        }
                        if (matchIdx >= 0) {
                            if (timeType) {
                                *timeType = getTimeType(tzdbNameMatches->getNameTypeAt(matchIdx));
                            }
                            pos.setIndex(matchPos);
                            getTimeZoneID(tzdbNameMatches.getAlias(), matchIdx, tzID);
                            U_ASSERT(!tzID.isEmpty());
                            return TimeZone::createTimeZone(tzID);
                        }
                    }
                }
            }
            break;
        }
    case UTZFMT_STYLE_GENERIC_LONG:
    case UTZFMT_STYLE_GENERIC_SHORT:
    case UTZFMT_STYLE_GENERIC_LOCATION:
        {
            int32_t genericNameTypes = 0;
            switch (style) {
            case UTZFMT_STYLE_GENERIC_LOCATION:
                genericNameTypes = UTZGNM_LOCATION;
                break;

            case UTZFMT_STYLE_GENERIC_LONG:
                genericNameTypes = UTZGNM_LONG | UTZGNM_LOCATION;
                break;

            case UTZFMT_STYLE_GENERIC_SHORT:
                genericNameTypes = UTZGNM_SHORT | UTZGNM_LOCATION;
                break;

            default:
                U_ASSERT(FALSE);
            }

            int32_t len = 0;
            UTimeZoneFormatTimeType tt = UTZFMT_TIME_TYPE_UNKNOWN;
            const TimeZoneGenericNames *gnames = getTimeZoneGenericNames(status);
            if (U_SUCCESS(status)) {
                len = gnames->findBestMatch(text, startIdx, genericNameTypes, tzID, tt, status);
            }
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            if (len > 0) {
                // Found a match
                if (timeType) {
                    *timeType = tt;
                }
                pos.setIndex(startIdx + len);
                U_ASSERT(!tzID.isEmpty());
                return TimeZone::createTimeZone(tzID);
            }

            break;
        }
    case UTZFMT_STYLE_ZONE_ID:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    case UTZFMT_STYLE_ZONE_ID_SHORT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseShortZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    case UTZFMT_STYLE_EXEMPLAR_LOCATION:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseExemplarLocation(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    }
    evaluated |= STYLE_PARSE_FLAGS[style];


    if (parsedPos > startIdx) {
        // When the specified style is one of SPECIFIC_XXX or GENERIC_XXX, we tried to parse the input
        // as localized GMT format earlier. If parsedOffset is positive, it means it was successfully
        // parsed as localized GMT format, but offset digits were not detected (more specifically, GMT
        // zero format). Then, it tried to find a match within the set of display names, but could not
        // find a match. At this point, we can safely assume the input text contains the localized
        // GMT format.
        U_ASSERT(parsedOffset != UNKNOWN_OFFSET);
        pos.setIndex(parsedPos);
        return createTimeZoneForOffset(parsedOffset);
    }

    // Failed to parse the input text as the time zone format in the specified style.
    // Check the longest match among other styles below.
    UChar parsedIDBuf[32];
    UnicodeString parsedID(parsedIDBuf, 0, UPRV_LENGTHOF(parsedIDBuf));
    UTimeZoneFormatTimeType parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;

    U_ASSERT(parsedPos < 0);
    U_ASSERT(parsedOffset == UNKNOWN_OFFSET);

    // ISO 8601
    if (parsedPos < maxPos &&
        ((evaluated & ISO_Z_STYLE_FLAG) == 0 || (evaluated & ISO_LOCAL_STYLE_FLAG) == 0)) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetISO8601(text, tmpPos, FALSE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Note: When ISO 8601 format contains offset digits, it should not
            // collide with other formats. However, ISO 8601 UTC format "Z" (single letter)
            // may collide with other names. In this case, we need to evaluate other names.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
                U_ASSERT(parsedPos == startIdx + 1);    // only when "Z" is used
            }
        }
    }

    // Localized GMT format
    if (parsedPos < maxPos &&
        (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT]) == 0) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, FALSE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Evaluate other names - see the comment earlier in this method.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
            }
        }
    }

    if (parsedPos < maxPos &&
        (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT]) == 0) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, TRUE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Evaluate other names - see the comment earlier in this method.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
            }
        }
    }

    // When ParseOption.ALL_STYLES is available, we also try to look all possible display names and IDs.
    // For example, when style is GENERIC_LONG, "EST" (SPECIFIC_SHORT) is never
    // used for America/New_York. With parseAllStyles true, this code parses "EST"
    // as America/New_York.

    // Note: Adding all possible names into the trie used by the implementation is quite heavy operation,
    // which we want to avoid normally (note that we cache the trie, so this is applicable to the
    // first time only as long as the cache does not expire).

    if (parseOptions & UTZFMT_PARSE_OPTION_ALL_STYLES) {
        // Try all specific names and exemplar location names
        if (parsedPos < maxPos) {
            LocalPointer<TimeZoneNames::MatchInfoCollection> specificMatches(fTimeZoneNames->find(text, startIdx, ALL_SIMPLE_NAME_TYPES, status));
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            int32_t specificMatchIdx = -1;
            int32_t matchPos = -1;
            if (!specificMatches.isNull()) {
                for (int32_t i = 0; i < specificMatches->size(); i++) {
                    if (startIdx + specificMatches->getMatchLengthAt(i) > matchPos) {
                        specificMatchIdx = i;
                        matchPos = startIdx + specificMatches->getMatchLengthAt(i);
                    }
                }
            }
            if (parsedPos < matchPos) {
                U_ASSERT(specificMatchIdx >= 0);
                parsedPos = matchPos;
                getTimeZoneID(specificMatches.getAlias(), specificMatchIdx, parsedID);
                parsedTimeType = getTimeType(specificMatches->getNameTypeAt(specificMatchIdx));
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
        if (parseTZDBAbbrev && parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_SPECIFIC_SHORT]) == 0) {
            const TZDBTimeZoneNames *tzdbTimeZoneNames = getTZDBTimeZoneNames(status);
            if (U_SUCCESS(status)) {
                LocalPointer<TimeZoneNames::MatchInfoCollection> tzdbNameMatches(
                    tzdbTimeZoneNames->find(text, startIdx, ALL_SIMPLE_NAME_TYPES, status));
                if (U_FAILURE(status)) {
                    pos.setErrorIndex(startIdx);
                    return NULL;
                }
                int32_t tzdbNameMatchIdx = -1;
                int32_t matchPos = -1;
                if (!tzdbNameMatches.isNull()) {
                    for (int32_t i = 0; i < tzdbNameMatches->size(); i++) {
                        if (startIdx + tzdbNameMatches->getMatchLengthAt(i) > matchPos) {
                            tzdbNameMatchIdx = i;
                            matchPos = startIdx + tzdbNameMatches->getMatchLengthAt(i);
                        }
                    }
                }
                if (parsedPos < matchPos) {
                    U_ASSERT(tzdbNameMatchIdx >= 0);
                    parsedPos = matchPos;
                    getTimeZoneID(tzdbNameMatches.getAlias(), tzdbNameMatchIdx, parsedID);
                    parsedTimeType = getTimeType(tzdbNameMatches->getNameTypeAt(tzdbNameMatchIdx));
                    parsedOffset = UNKNOWN_OFFSET;
                }
            }
        }
        // Try generic names
        if (parsedPos < maxPos) {
            int32_t genMatchLen = -1;
            UTimeZoneFormatTimeType tt = UTZFMT_TIME_TYPE_UNKNOWN;

            const TimeZoneGenericNames *gnames = getTimeZoneGenericNames(status);
            if (U_SUCCESS(status)) {
                genMatchLen = gnames->findBestMatch(text, startIdx, ALL_GENERIC_NAME_TYPES, tzID, tt, status);
            }
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }

            if (genMatchLen > 0 && parsedPos < startIdx + genMatchLen) {
                parsedPos = startIdx + genMatchLen;
                parsedID.setTo(tzID);
                parsedTimeType = tt;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }

        // Try time zone ID
        if (parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_ZONE_ID]) == 0) {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1 && parsedPos < tmpPos.getIndex()) {
                parsedPos = tmpPos.getIndex();
                parsedID.setTo(tzID);
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
        // Try short time zone ID
        if (parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_ZONE_ID]) == 0) {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseShortZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1 && parsedPos < tmpPos.getIndex()) {
                parsedPos = tmpPos.getIndex();
                parsedID.setTo(tzID);
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
    }

    if (parsedPos > startIdx) {
        // Parsed successfully
        TimeZone* parsedTZ;
        if (parsedID.length() > 0) {
            parsedTZ = TimeZone::createTimeZone(parsedID);
        } else {
            U_ASSERT(parsedOffset != UNKNOWN_OFFSET);
            parsedTZ = createTimeZoneForOffset(parsedOffset);
        }
        if (timeType) {
            *timeType = parsedTimeType;
        }
        pos.setIndex(parsedPos);
        return parsedTZ;
    }

    pos.setErrorIndex(startIdx);
    return NULL;
}